

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double * r8row_min(int m,int n,double *a)

{
  double *pdVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < m) {
    uVar2 = (long)m * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  if (0 < m) {
    uVar2 = (ulong)(uint)m;
    pdVar3 = a + uVar2;
    uVar4 = 0;
    do {
      pdVar1[uVar4] = a[uVar4];
      if (1 < n) {
        lVar5 = (ulong)(uint)n - 1;
        pdVar6 = pdVar3;
        dVar7 = pdVar1[uVar4];
        do {
          dVar8 = *pdVar6;
          if (dVar7 <= *pdVar6) {
            dVar8 = dVar7;
          }
          pdVar6 = pdVar6 + uVar2;
          lVar5 = lVar5 + -1;
          dVar7 = dVar8;
        } while (lVar5 != 0);
        pdVar1[uVar4] = dVar8;
      }
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (uVar4 != uVar2);
  }
  return pdVar1;
}

Assistant:

double *r8row_min ( int m, int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8ROW_MIN returns the minimums of an R8ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, double A[M*N], the array to be examined.
//
//    Output, double R8ROW_MIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  double *amin;

  amin = new double[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}